

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsBodyTranslation::ArchiveOUT(ChShaftsBodyTranslation *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsBody>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_30._value = &this->shaft_dir;
  local_30._name = "shaft_dir";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->shaft_pos;
  local_48._name = "shaft_pos";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChShaftsBodyTranslation::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsBody>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(shaft_dir);
    marchive << CHNVP(shaft_pos);
    // marchive << CHNVP(shaft);  //***TODO*** serialize, with shared ptr
    // marchive << CHNVP(body); //***TODO*** serialize, with shared ptr
}